

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::ChangeVertex(ON_Brep *this,int old_vi,int new_vi,bool bClearTolerances)

{
  ON_BrepVertex *pOVar1;
  int trim_index;
  ON_BrepVertex *pOVar2;
  ON_BrepEdge *pOVar3;
  ON_BrepTrim *pOVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint local_6c;
  int ei;
  ON_BrepVertex *local_60;
  ON_BrepVertex *local_58;
  ON_SimpleArray<int> *local_50;
  long local_48;
  ON_BrepEdge *local_40;
  long local_38;
  
  bVar7 = true;
  if (old_vi != new_vi) {
    pOVar2 = Vertex(this,old_vi);
    local_58 = Vertex(this,new_vi);
    if (local_58 == (ON_BrepVertex *)0x0 || pOVar2 == (ON_BrepVertex *)0x0) {
      bVar7 = false;
    }
    else if (pOVar2 != local_58) {
      pOVar1 = (this->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.
               m_a;
      iVar9 = (int)(((long)pOVar2 - (long)pOVar1) / 0x58);
      iVar6 = (int)(((long)local_58 - (long)pOVar1) / 0x58);
      if (iVar9 != iVar6) {
        local_50 = &local_58->m_ei;
        lVar5 = 0;
        local_60 = pOVar2;
        while (lVar5 < (local_60->m_ei).m_count) {
          ei = (local_60->m_ei).m_a[lVar5];
          local_48 = lVar5;
          pOVar3 = Edge(this,ei);
          if (pOVar3 != (ON_BrepEdge *)0x0) {
            local_6c = 0;
            if (pOVar3->m_vi[0] != local_60->m_vertex_index) {
              local_6c = 1;
              if (pOVar3->m_vi[1] != local_60->m_vertex_index) goto LAB_0043d876;
            }
            ON_SimpleArray<int>::Append(local_50,&ei);
            pOVar3->m_vi[local_6c] = iVar6;
            if (bClearTolerances) {
              pOVar3->m_tolerance = -1.23432101234321e+308;
              local_58->m_tolerance = -1.23432101234321e+308;
            }
            lVar5 = 0;
            local_40 = pOVar3;
            while (lVar5 < (local_40->m_ti).m_count) {
              local_38 = lVar5;
              pOVar4 = Trim(this,(local_40->m_ti).m_a[lVar5]);
              if (pOVar4 != (ON_BrepTrim *)0x0) {
                bVar7 = pOVar4->m_bRev3d;
                uVar8 = local_6c ^ bVar7;
                pOVar4->m_vi[uVar8] = iVar6;
                while( true ) {
                  if (local_6c == bVar7) {
                    trim_index = PrevTrim(this,pOVar4->m_trim_index);
                  }
                  else {
                    trim_index = NextTrim(this,pOVar4->m_trim_index);
                  }
                  pOVar4 = Trim(this,trim_index);
                  if ((((pOVar4 == (ON_BrepTrim *)0x0) || (-1 < pOVar4->m_ei)) ||
                      (pOVar4->m_vi[uVar8 ^ 1] != iVar9)) ||
                     (pOVar4->m_vi[uVar8 ^ 1] = iVar6, pOVar4->m_vi[uVar8] != iVar9)) break;
                  pOVar4->m_vi[uVar8] = iVar6;
                }
              }
              lVar5 = local_38 + 1;
            }
          }
LAB_0043d876:
          lVar5 = local_48 + 1;
        }
        ON_SimpleArray<int>::Destroy(&local_60->m_ei);
      }
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool ON_Brep::ChangeVertex( int old_vi, int new_vi, bool bClearTolerances )
{
  if ( old_vi == new_vi )
    return true;

  ON_BrepVertex* old_v = Vertex(old_vi);
  ON_BrepVertex* new_v = Vertex(new_vi);
  
  if ( 0 == old_v )
    return false;
  if ( 0 == new_v )
    return false;
  if( old_v == new_v )
    return true;

  // clear type bits
  old_vi = (int)(old_v - m_V.Array()); // the (int) is for 64 bit size_t conversion
  new_vi = (int)(new_v - m_V.Array());
  if ( old_vi == new_vi )
    return true;

  int vei, evi, eti, tvi, ei;

  for ( vei = 0; vei < old_v->m_ei.Count(); vei++ )
  {
    ei = old_v->m_ei[vei];
    ON_BrepEdge* edge = Edge( ei );
    if ( 0 == edge )
      continue;
    // edges that start/end at the same vertex are listed twice in old_v->m_ei[].
    if ( edge->m_vi[0] == old_v->m_vertex_index )
      evi = 0;
    else if ( edge->m_vi[1] == old_v->m_vertex_index )
      evi = 1;
    else
      continue;

    // connect edge to new vertex
    new_v->m_ei.Append(ei);
    edge->m_vi[evi] = new_vi;
    if ( bClearTolerances )
    {
      edge->m_tolerance = ON_UNSET_VALUE;
      new_v->m_tolerance = ON_UNSET_VALUE;
    }

    for ( eti = 0; eti < edge->m_ti.Count(); eti++ )
    {
      ON_BrepTrim* trim = Trim( edge->m_ti[eti]);
      if ( 0 == trim )
        continue;
      tvi = trim->m_bRev3d ? 1-evi : evi;
      trim->m_vi[tvi] = new_vi;
      for(;;)
      {
        if ( 0 == tvi )
          trim = Trim(PrevTrim(trim->m_trim_index));
        else if ( 1 == tvi )
          trim = Trim(NextTrim(trim->m_trim_index));
        else
          break;

        if ( 0 == trim )
          break;

        if ( trim->m_ei >= 0 )
          break; // not singular

        if ( trim->m_vi[1-tvi] == old_vi )
          trim->m_vi[1-tvi] = new_vi;
        else
          break;

        if ( trim->m_vi[tvi] == old_vi )
          trim->m_vi[tvi] = new_vi;
        else
          break;
      }
    }
  }
  old_v->m_ei.Destroy();
  return true;
}